

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram-cache.cpp
# Opt level: O1

void common_ngram_cache_draft
               (vector<int,_std::allocator<int>_> *inp,vector<int,_std::allocator<int>_> *draft,
               int n_draft,int ngram_min,int ngram_max,common_ngram_cache *nc_context,
               common_ngram_cache *nc_dynamic,common_ngram_cache *nc_static)

{
  int iVar1;
  iterator __position;
  long lVar2;
  iterator iVar3;
  long lVar4;
  common_log *log;
  __node_base _Var5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  pointer piVar9;
  long lVar10;
  pointer piVar11;
  pointer piVar12;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var13;
  int iVar14;
  uint uVar15;
  bool bVar16;
  common_ngram ngram_static;
  common_ngram ngram_cd;
  common_ngram_cache_part part_static;
  uint local_110;
  uint local_10c;
  vector<common_ngram,_std::allocator<common_ngram>_> local_108;
  int local_f0;
  int local_ec;
  key_type local_e8;
  common_ngram_cache *local_d0;
  long local_c8;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_int,_int>,_false>_>_> local_c0
  ;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_b8;
  key_type local_78;
  undefined1 local_68 [32];
  float local_48;
  undefined1 local_40 [16];
  
  local_10c = ngram_min;
  local_ec = n_draft;
  local_d0 = nc_context;
  if ((long)(draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start != 4) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/ngram-cache.cpp"
               ,0x96,"GGML_ASSERT(%s) failed","draft.size() == 1");
  }
  local_c8 = (long)(inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2;
  iVar14 = (int)local_c8;
  if (1 < iVar14) {
    local_c8 = local_c8 + 0xfffffffe;
    local_f0 = ~ngram_min + iVar14;
    do {
      piVar11 = (draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar8 = (int)((long)(draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar11 >> 2);
      if (local_ec < iVar8) {
        return;
      }
      local_110 = 0xffffffff;
      iVar6 = (int)local_c8 + iVar8 + -1;
      local_e8.tokens[0] = -1;
      local_e8.tokens[1] = -1;
      local_e8.tokens[2] = -1;
      local_e8.tokens[3] = -1;
      if (iVar6 < iVar8 + (int)local_c8 + 1) {
        piVar9 = (inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar2 = (long)(inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar9;
        uVar7 = (ulong)iVar6;
        lVar4 = uVar7 * 4;
        piVar9 = piVar9 + uVar7;
        lVar10 = 0;
        do {
          piVar12 = (pointer)((long)piVar11 + (lVar4 - lVar2) + 4);
          if (uVar7 < (ulong)(lVar2 >> 2)) {
            piVar12 = piVar9;
          }
          *(undefined4 *)((long)local_e8.tokens + lVar10) = *(undefined4 *)((long)piVar12 + lVar10);
          uVar7 = uVar7 + 1;
          lVar10 = lVar10 + 4;
        } while ((int)lVar10 != 8);
      }
      iVar3 = std::
              _Hashtable<common_ngram,_std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<common_ngram>,_common_ngram_hash_function,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&nc_static->_M_h,&local_e8);
      local_68._0_8_ = local_40 + 8;
      local_68._8_8_ = 1;
      local_68._16_16_ = (undefined1  [16])0x0;
      local_48 = 1.0;
      local_40 = (undefined1  [16])0x0;
      if ((iVar3.
           super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
           ._M_cur != (__node_type *)0x0) &&
         ((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)((long)iVar3.
                    super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
                    ._M_cur + 0x18) !=
          (_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           *)local_68)) {
        std::
        _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_assign_elements<std::_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
                  ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)local_68,
                   (_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)((long)iVar3.
                             super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
                             ._M_cur + 0x18));
      }
      local_108.super__Vector_base<common_ngram,_std::allocator<common_ngram>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_108.super__Vector_base<common_ngram,_std::allocator<common_ngram>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108.super__Vector_base<common_ngram,_std::allocator<common_ngram>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (common_ngram *)0x0;
      iVar8 = local_f0;
      uVar15 = local_10c;
      if ((int)local_10c <= ngram_max) {
        do {
          piVar11 = (draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          local_b8._M_buckets = (__buckets_ptr)0xffffffffffffffff;
          local_b8._M_bucket_count = 0xffffffffffffffff;
          if (0 < (int)uVar15) {
            iVar6 = (int)((ulong)((long)(draft->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)piVar11)
                         >> 2);
            piVar9 = (inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar4 = (long)(inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar9;
            uVar7 = (ulong)(iVar6 + iVar8);
            piVar9 = piVar9 + uVar7;
            piVar11 = (pointer)((long)piVar11 + (uVar7 * 4 - lVar4));
            p_Var13 = &local_b8;
            do {
              piVar11 = piVar11 + 1;
              piVar12 = piVar11;
              if (uVar7 < (ulong)(lVar4 >> 2)) {
                piVar12 = piVar9;
              }
              *(int *)&p_Var13->_M_buckets = *piVar12;
              uVar7 = uVar7 + 1;
              p_Var13 = (_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)((long)&p_Var13->_M_buckets + 4);
              piVar9 = piVar9 + 1;
            } while ((long)uVar7 < (long)(int)(~uVar15 + iVar14 + uVar15 + iVar6));
          }
          if (local_108.super__Vector_base<common_ngram,_std::allocator<common_ngram>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<common_ngram,_std::allocator<common_ngram>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<common_ngram,std::allocator<common_ngram>>::
            _M_realloc_insert<common_ngram_const&>
                      ((vector<common_ngram,std::allocator<common_ngram>> *)&local_108,
                       (iterator)
                       local_108.super__Vector_base<common_ngram,_std::allocator<common_ngram>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(common_ngram *)&local_b8);
          }
          else {
            *(__buckets_ptr *)
             (local_108.super__Vector_base<common_ngram,_std::allocator<common_ngram>_>._M_impl.
              super__Vector_impl_data._M_finish)->tokens = local_b8._M_buckets;
            *(size_type *)
             ((local_108.super__Vector_base<common_ngram,_std::allocator<common_ngram>_>._M_impl.
               super__Vector_impl_data._M_finish)->tokens + 2) = local_b8._M_bucket_count;
            local_108.super__Vector_base<common_ngram,_std::allocator<common_ngram>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<common_ngram,_std::allocator<common_ngram>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          iVar8 = iVar8 + -1;
          bVar16 = uVar15 != ngram_max;
          uVar15 = uVar15 + 1;
        } while (bVar16);
      }
      if (local_110 == 0xffffffff) {
        local_110 = try_draft(local_d0,&local_108,(common_ngram_cache_part *)local_68,
                              draft_min_sample_size_lax,draft_min_percent_lax);
      }
      if (local_110 == 0xffffffff) {
        local_110 = try_draft(nc_dynamic,&local_108,(common_ngram_cache_part *)local_68,
                              draft_min_sample_size_strict,draft_min_percent_strict);
      }
      if (local_110 == 0xffffffff) {
        local_78.tokens[1] = local_e8.tokens[1];
        local_78.tokens[0] = local_e8.tokens[0];
        local_78.tokens[3] = local_e8.tokens[3];
        local_78.tokens[2] = local_e8.tokens[2];
        iVar3 = std::
                _Hashtable<common_ngram,_std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<common_ngram>,_common_ngram_hash_function,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&nc_static->_M_h,&local_78);
        if (iVar3.
            super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_110 = 0xffffffff;
        }
        else {
          local_b8._M_buckets = (__buckets_ptr)0x0;
          local_b8._M_bucket_count =
               *(size_type *)
                ((long)iVar3.
                       super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
                       ._M_cur + 0x20);
          local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_b8._M_element_count =
               *(size_type *)
                ((long)iVar3.
                       super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
                       ._M_cur + 0x30);
          local_b8._M_rehash_policy._0_8_ =
               *(undefined8 *)
                ((long)iVar3.
                       super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
                       ._M_cur + 0x38);
          local_b8._M_rehash_policy._M_next_resize =
               *(size_t *)
                ((long)iVar3.
                       super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
                       ._M_cur + 0x40);
          local_b8._M_single_bucket = (__node_base_ptr)0x0;
          local_c0._M_h = (__hashtable_alloc *)&local_b8;
          std::
          _Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_assign<std::_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<int_const,int>,false>>>>
                    ((_Hashtable<int,std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)local_c0._M_h,
                     (_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)((long)iVar3.
                               super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
                               ._M_cur + 0x18),&local_c0);
          uVar15 = 0xffffffff;
          if (local_b8._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
            iVar6 = 0;
            iVar8 = 0;
          }
          else {
            iVar8 = 0;
            iVar6 = 0;
            _Var5._M_nxt = local_b8._M_before_begin._M_nxt;
            do {
              iVar1 = *(int *)((long)&_Var5._M_nxt[1]._M_nxt + 4);
              if (iVar8 < iVar1) {
                uVar15 = *(uint *)&_Var5._M_nxt[1]._M_nxt;
                iVar8 = iVar1;
              }
              iVar6 = iVar6 + iVar1;
              _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt;
            } while (_Var5._M_nxt != (_Hash_node_base *)0x0);
            iVar8 = iVar8 * 100;
          }
          if (iVar8 < iVar6 * 0x32) {
            uVar15 = 0xffffffff;
          }
          if (iVar6 < 2) {
            uVar15 = 0xffffffff;
          }
          std::
          _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&local_b8);
          local_110 = uVar15;
        }
      }
      uVar15 = local_110;
      if (local_110 != 0xffffffff) {
        if (-1 < common_log_verbosity_thold) {
          log = common_log_main();
          common_log_add(log,GGML_LOG_LEVEL_NONE," - draft candidate: token=%d\n",(ulong)local_110);
        }
        __position._M_current =
             (draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
        if (__position._M_current ==
            (draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)draft,__position,(int *)&local_110);
        }
        else {
          *__position._M_current = local_110;
          (draft->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = __position._M_current + 1;
        }
      }
      if (local_108.super__Vector_base<common_ngram,_std::allocator<common_ngram>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.super__Vector_base<common_ngram,_std::allocator<common_ngram>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_108.
                              super__Vector_base<common_ngram,_std::allocator<common_ngram>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.
                              super__Vector_base<common_ngram,_std::allocator<common_ngram>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_68);
    } while (uVar15 != 0xffffffff);
  }
  return;
}

Assistant:

void common_ngram_cache_draft(
    std::vector<llama_token> & inp, std::vector<llama_token> & draft, int n_draft, int ngram_min, int ngram_max,
    common_ngram_cache & nc_context, common_ngram_cache & nc_dynamic, common_ngram_cache & nc_static
) {
    GGML_ASSERT(draft.size() == 1);
    const int inp_size = inp.size();

    if (inp_size < LLAMA_NGRAM_STATIC) {
        return;
    }

    while ((int) draft.size()-1 < n_draft) {
        llama_token drafted_token = LLAMA_TOKEN_NULL;

        const int ngram_start_static = inp_size-LLAMA_NGRAM_STATIC + draft.size()-1;
        common_ngram ngram_static;
        for (int j = ngram_start_static; j < ngram_start_static + LLAMA_NGRAM_STATIC; ++j) {
            ngram_static.tokens[j-ngram_start_static] = get_token(inp, draft, j);
        }
        common_ngram_cache::iterator part_static_it = nc_static.find(ngram_static);
        common_ngram_cache_part part_static;
        if (part_static_it != nc_static.end()) {
            part_static = part_static_it->second;
        }

        // cd = context + dynamic
        std::vector<common_ngram> ngrams_cd;
        for (int ngram_size_cd = ngram_min; ngram_size_cd <= ngram_max; ++ngram_size_cd) {
            const int ngram_start_cd = inp_size-ngram_size_cd + draft.size()-1;
            common_ngram ngram_cd;
            for (int j = ngram_start_cd; j < ngram_start_cd + ngram_size_cd; ++j) {
                ngram_cd.tokens[j-ngram_start_cd] = get_token(inp, draft, j);
            }
            ngrams_cd.push_back(ngram_cd);
        }
        if (drafted_token == LLAMA_TOKEN_NULL) {
            drafted_token = try_draft(nc_context, ngrams_cd, part_static, draft_min_sample_size_lax, draft_min_percent_lax);
        }
        if (drafted_token == LLAMA_TOKEN_NULL) {
            drafted_token = try_draft(nc_dynamic, ngrams_cd, part_static, draft_min_sample_size_strict, draft_min_percent_strict);
        }
        if (drafted_token == LLAMA_TOKEN_NULL) {
            drafted_token = try_draft(nc_static, ngram_static);
        }

        if (drafted_token == LLAMA_TOKEN_NULL) {
            break;
        }

        LOG(" - draft candidate: token=%d\n", drafted_token);
        draft.push_back(drafted_token);
    }
}